

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position
          )

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  batch sin_angle;
  batch cos_angle;
  batch *pbVar12;
  PolarExtentCoreContext *ctx_00;
  undefined1 auVar13 [48];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 in_stack_fffffffffffffed8 [14];
  ushort uVar20;
  undefined1 in_stack_fffffffffffffee8 [48];
  
  auVar18._0_8_ = ctx->num_points;
  auVar18._8_8_ = ctx->num_speakers;
  auVar18._16_8_ = ctx->real_num_speakers;
  auVar18._24_8_ = ctx->xs;
  auVar18._32_8_ = ctx->ys;
  auVar18._40_8_ = ctx->zs;
  auVar18._48_8_ = ctx->panning_results;
  auVar18._56_8_ = ctx->summed_panning_results;
  auVar17[0] = ctx->is_circular;
  auVar17._1_3_ = *(undefined3 *)&ctx->field_0x41;
  auVar17._4_4_ = ctx->flippedBasis[0];
  auVar17._8_4_ = ctx->flippedBasis[1];
  auVar17._12_4_ = ctx->flippedBasis[2];
  auVar17._16_4_ = ctx->flippedBasis[3];
  auVar17._20_4_ = ctx->flippedBasis[4];
  auVar17._24_4_ = ctx->flippedBasis[5];
  auVar17._28_4_ = ctx->flippedBasis[6];
  auVar17._32_4_ = ctx->flippedBasis[7];
  auVar17._36_4_ = ctx->flippedBasis[8];
  auVar17._40_4_ = ctx->circle_test[0];
  auVar17._44_4_ = ctx->circle_test[1];
  auVar17._48_4_ = ctx->right_circle_centre[0];
  auVar17._52_4_ = ctx->right_circle_centre[1];
  auVar17._56_4_ = ctx->cos_start_angle;
  auVar17._60_4_ = ctx->cos_end_angle;
  auVar19 = *(undefined1 (*) [64])&ctx->sin_start_angle;
  uVar1 = *(undefined4 *)((long)&this[9].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  auVar14._32_4_ = uVar1;
  auVar14._36_4_ = uVar1;
  auVar14._40_4_ = uVar1;
  auVar14._44_4_ = uVar1;
  auVar14._48_4_ = uVar1;
  auVar14._52_4_ = uVar1;
  auVar14._56_4_ = uVar1;
  auVar14._60_4_ = uVar1;
  auVar14 = vmulps_avx512f(auVar19,auVar14);
  uVar1 = *(undefined4 *)&this[9].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  auVar15._32_4_ = uVar1;
  auVar15._36_4_ = uVar1;
  auVar15._40_4_ = uVar1;
  auVar15._44_4_ = uVar1;
  auVar15._48_4_ = uVar1;
  auVar15._52_4_ = uVar1;
  auVar15._56_4_ = uVar1;
  auVar15._60_4_ = uVar1;
  auVar14 = vfmadd231ps_avx512f(auVar14,auVar17,auVar15);
  uVar1 = *(undefined4 *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  auVar16._32_4_ = uVar1;
  auVar16._36_4_ = uVar1;
  auVar16._40_4_ = uVar1;
  auVar16._44_4_ = uVar1;
  auVar16._48_4_ = uVar1;
  auVar16._52_4_ = uVar1;
  auVar16._56_4_ = uVar1;
  auVar16._60_4_ = uVar1;
  auVar14 = vfmadd231ps_avx512f(auVar14,auVar18,auVar16);
  uVar1 = *(undefined4 *)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar3._16_4_ = uVar1;
  auVar3._20_4_ = uVar1;
  auVar3._24_4_ = uVar1;
  auVar3._28_4_ = uVar1;
  auVar3._32_4_ = uVar1;
  auVar3._36_4_ = uVar1;
  auVar3._40_4_ = uVar1;
  auVar3._44_4_ = uVar1;
  auVar3._48_4_ = uVar1;
  auVar3._52_4_ = uVar1;
  auVar3._56_4_ = uVar1;
  auVar3._60_4_ = uVar1;
  auVar15 = vmulps_avx512f(auVar19,auVar3);
  uVar1 = *(undefined4 *)((long)&this[10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar4._4_4_ = uVar1;
  auVar4._0_4_ = uVar1;
  auVar4._8_4_ = uVar1;
  auVar4._12_4_ = uVar1;
  auVar4._16_4_ = uVar1;
  auVar4._20_4_ = uVar1;
  auVar4._24_4_ = uVar1;
  auVar4._28_4_ = uVar1;
  auVar4._32_4_ = uVar1;
  auVar4._36_4_ = uVar1;
  auVar4._40_4_ = uVar1;
  auVar4._44_4_ = uVar1;
  auVar4._48_4_ = uVar1;
  auVar4._52_4_ = uVar1;
  auVar4._56_4_ = uVar1;
  auVar4._60_4_ = uVar1;
  auVar15 = vfmadd231ps_avx512f(auVar15,auVar17,auVar4);
  uVar1 = *(undefined4 *)&this[10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar5._16_4_ = uVar1;
  auVar5._20_4_ = uVar1;
  auVar5._24_4_ = uVar1;
  auVar5._28_4_ = uVar1;
  auVar5._32_4_ = uVar1;
  auVar5._36_4_ = uVar1;
  auVar5._40_4_ = uVar1;
  auVar5._44_4_ = uVar1;
  auVar5._48_4_ = uVar1;
  auVar5._52_4_ = uVar1;
  auVar5._56_4_ = uVar1;
  auVar5._60_4_ = uVar1;
  auVar15 = vfmadd231ps_avx512f(auVar15,auVar18,auVar5);
  uVar1 = *(undefined4 *)((long)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar6._16_4_ = uVar1;
  auVar6._20_4_ = uVar1;
  auVar6._24_4_ = uVar1;
  auVar6._28_4_ = uVar1;
  auVar6._32_4_ = uVar1;
  auVar6._36_4_ = uVar1;
  auVar6._40_4_ = uVar1;
  auVar6._44_4_ = uVar1;
  auVar6._48_4_ = uVar1;
  auVar6._52_4_ = uVar1;
  auVar6._56_4_ = uVar1;
  auVar6._60_4_ = uVar1;
  auVar16 = vmulps_avx512f(auVar19,auVar6);
  uVar1 = *(undefined4 *)&this[0xc].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  auVar19._32_4_ = uVar1;
  auVar19._36_4_ = uVar1;
  auVar19._40_4_ = uVar1;
  auVar19._44_4_ = uVar1;
  auVar19._48_4_ = uVar1;
  auVar19._52_4_ = uVar1;
  auVar19._56_4_ = uVar1;
  auVar19._60_4_ = uVar1;
  auVar17 = vfmadd231ps_avx512f(auVar16,auVar17,auVar19);
  uVar1 = *(undefined4 *)((long)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7._16_4_ = uVar1;
  auVar7._20_4_ = uVar1;
  auVar7._24_4_ = uVar1;
  auVar7._28_4_ = uVar1;
  auVar7._32_4_ = uVar1;
  auVar7._36_4_ = uVar1;
  auVar7._40_4_ = uVar1;
  auVar7._44_4_ = uVar1;
  auVar7._48_4_ = uVar1;
  auVar7._52_4_ = uVar1;
  auVar7._56_4_ = uVar1;
  auVar7._60_4_ = uVar1;
  auVar18 = vfmadd231ps_avx512f(auVar17,auVar18,auVar7);
  auVar17 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
  auVar19 = vandps_avx512dq(auVar14,auVar17);
  uVar1 = *(undefined4 *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar8._16_4_ = uVar1;
  auVar8._20_4_ = uVar1;
  auVar8._24_4_ = uVar1;
  auVar8._28_4_ = uVar1;
  auVar8._32_4_ = uVar1;
  auVar8._36_4_ = uVar1;
  auVar8._40_4_ = uVar1;
  auVar8._44_4_ = uVar1;
  auVar8._48_4_ = uVar1;
  auVar8._52_4_ = uVar1;
  auVar8._56_4_ = uVar1;
  auVar8._60_4_ = uVar1;
  auVar14 = vmulps_avx512f(auVar15,auVar8);
  uVar1 = *(undefined4 *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar9._16_4_ = uVar1;
  auVar9._20_4_ = uVar1;
  auVar9._24_4_ = uVar1;
  auVar9._28_4_ = uVar1;
  auVar9._32_4_ = uVar1;
  auVar9._36_4_ = uVar1;
  auVar9._40_4_ = uVar1;
  auVar9._44_4_ = uVar1;
  auVar9._48_4_ = uVar1;
  auVar9._52_4_ = uVar1;
  auVar9._56_4_ = uVar1;
  auVar9._60_4_ = uVar1;
  auVar14 = vfmadd231ps_avx512f(auVar14,auVar19,auVar9);
  uVar2 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar14,2);
  uVar20 = (ushort)uVar2;
  auVar18 = vandps_avx512dq(auVar18,auVar17);
  auVar13 = auVar18._0_48_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3].
  _2_2_ = uVar20;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_14_
       = in_stack_fffffffffffffed8;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data.
  _16_48_ = in_stack_fffffffffffffee8;
  weight_from_sin(__return_storage_ptr__,this,ctx,sin_angle);
  uVar1 = *(undefined4 *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  auVar10._32_4_ = uVar1;
  auVar10._36_4_ = uVar1;
  auVar10._40_4_ = uVar1;
  auVar10._44_4_ = uVar1;
  auVar10._48_4_ = uVar1;
  auVar10._52_4_ = uVar1;
  auVar10._56_4_ = uVar1;
  auVar10._60_4_ = uVar1;
  auVar18 = vmulps_avx512f(auVar15,auVar10);
  uVar1 = *(undefined4 *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  auVar11._32_4_ = uVar1;
  auVar11._36_4_ = uVar1;
  auVar11._40_4_ = uVar1;
  auVar11._44_4_ = uVar1;
  auVar11._48_4_ = uVar1;
  auVar11._52_4_ = uVar1;
  auVar11._56_4_ = uVar1;
  auVar11._60_4_ = uVar1;
  vfmadd231ps_avx512f(auVar18,auVar19,auVar11);
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3].
  _2_2_ = uVar20;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_14_
       = in_stack_fffffffffffffed8;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[4] =
       (float)auVar13._0_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[5] =
       (float)auVar13._4_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[6] =
       (float)auVar13._8_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[7] =
       (float)auVar13._12_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[8] =
       (float)auVar13._16_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[9] =
       (float)auVar13._20_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[10] =
       (float)auVar13._24_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xb] =
       (float)auVar13._28_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xc] =
       (float)auVar13._32_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xd] =
       (float)auVar13._36_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xe] =
       (float)auVar13._40_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf] =
       (float)auVar13._44_4_;
  pbVar12 = weight_from_cos(__return_storage_ptr__,this,ctx_00,cos_angle);
  if ((uVar20 != 0xffff) &&
     (pbVar12 = (batch *)CONCAT44((int)((ulong)pbVar12 >> 0x20),(uint)uVar20), uVar20 != 0)) {
    vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar14,2);
  }
  return pbVar12;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }